

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

BaseState<true> * __thiscall
ArrayState<true>::StartObject(ArrayState<true> *this,Context<true> *ctx)

{
  size_type sVar1;
  long in_RSI;
  BaseState<true> *in_stack_00000060;
  char *in_stack_00000068;
  Context<true> *in_stack_00000070;
  
  sVar1 = std::vector<Namespace<true>,_std::allocator<Namespace<true>_>_>::size
                    ((vector<Namespace<true>,_std::allocator<Namespace<true>_>_> *)(in_RSI + 0x30));
  if (sVar1 != 0) {
    Context<true>::CurrentNamespace((Context<true> *)0x266660);
  }
  Context<true>::PushNamespace(in_stack_00000070,in_stack_00000068,in_stack_00000060);
  return (BaseState<true> *)(in_RSI + 0x78);
}

Assistant:

BaseState<audit>* StartObject(Context<audit>& ctx)
  {
    // parse properties
    ctx.PushNamespace(ctx.namespace_path.size() > 0 ? ctx.CurrentNamespace().name : " ", this);

    return &ctx.default_state;
  }